

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O0

Expression * __thiscall
wasm::OptimizeInstructions::replaceZeroBitsWithZero(OptimizeInstructions *this,Expression *curr)

{
  bool bVar1;
  Index IVar2;
  Module *wasm;
  Const *result;
  Literal local_48;
  Builder local_30;
  Const *local_28;
  Const *zero;
  Expression *curr_local;
  OptimizeInstructions *this_local;
  
  zero = (Const *)curr;
  curr_local = (Expression *)this;
  bVar1 = Expression::is<wasm::Const>(curr);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    bVar1 = wasm::Type::isInteger
                      (&(zero->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.
                        type);
    if ((bVar1) &&
       (IVar2 = Bits::getMaxBits<wasm::OptimizeInstructions>((Expression *)zero,this), IVar2 == 0))
    {
      wasm = Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>::
             getModule(&(this->
                        super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
                        ).
                        super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                        .
                        super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
                      );
      Builder::Builder(&local_30,wasm);
      wasm::Literal::makeZero
                (&local_48,
                 (Type)(zero->super_SpecificExpression<(wasm::Expression::Id)14>).super_Expression.
                       type.id);
      result = Builder::makeConst(&local_30,&local_48);
      wasm::Literal::~Literal(&local_48);
      local_28 = result;
      this_local = (OptimizeInstructions *)
                   getDroppedChildrenAndAppend(this,(Expression *)zero,(Expression *)result);
    }
    else {
      this_local = (OptimizeInstructions *)0x0;
    }
    return (Expression *)this_local;
  }
  __assert_fail("!curr->is<Const>()",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/OptimizeInstructions.cpp"
                ,0x13f,
                "Expression *wasm::OptimizeInstructions::replaceZeroBitsWithZero(Expression *)");
}

Assistant:

Expression* replaceZeroBitsWithZero(Expression* curr) {
    // We should never be called with a constant.
    assert(!curr->is<Const>());

    if (!curr->type.isInteger() || Bits::getMaxBits(curr, this) != 0) {
      return nullptr;
    }

    auto zero = Builder(*getModule()).makeConst(Literal::makeZero(curr->type));
    return getDroppedChildrenAndAppend(curr, zero);
  }